

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtDumpElemDecl(xmlDebugCtxtPtr ctxt,xmlElementPtr elem)

{
  char local_13a8 [8];
  char buf [5001];
  xmlElementPtr elem_local;
  xmlDebugCtxtPtr ctxt_local;
  
  unique0x10000282 = (xmlNodePtr)elem;
  xmlCtxtDumpSpaces(ctxt);
  if (stack0xffffffffffffffe8 == (xmlNodePtr)0x0) {
    if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output,"Element declaration is NULL\n");
    }
  }
  else if (stack0xffffffffffffffe8->type == XML_ELEMENT_DECL) {
    if (stack0xffffffffffffffe8->name == (xmlChar *)0x0) {
      xmlDebugErr(ctxt,0x1397,"Element declaration has no name");
    }
    else if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output,"ELEMDECL(");
      xmlCtxtDumpString(ctxt,stack0xffffffffffffffe8->name);
      fprintf((FILE *)ctxt->output,")");
    }
    if (ctxt->check == 0) {
      switch(*(xmlElementTypeVal *)&stack0xffffffffffffffe8->ns) {
      case XML_ELEMENT_TYPE_UNDEFINED:
        fprintf((FILE *)ctxt->output,", UNDEFINED");
        break;
      case XML_ELEMENT_TYPE_EMPTY:
        fprintf((FILE *)ctxt->output,", EMPTY");
        break;
      case XML_ELEMENT_TYPE_ANY:
        fprintf((FILE *)ctxt->output,", ANY");
        break;
      case XML_ELEMENT_TYPE_MIXED:
        fprintf((FILE *)ctxt->output,", MIXED ");
        break;
      case XML_ELEMENT_TYPE_ELEMENT:
        fprintf((FILE *)ctxt->output,", MIXED ");
      }
      if ((stack0xffffffffffffffe8->type != XML_ELEMENT_NODE) &&
         ((xmlElementContentPtr)stack0xffffffffffffffe8->content != (xmlElementContentPtr)0x0)) {
        local_13a8[0] = '\0';
        xmlSnprintfElementContent
                  (local_13a8,5000,(xmlElementContentPtr)stack0xffffffffffffffe8->content,1);
        buf[0x1380] = '\0';
        fprintf((FILE *)ctxt->output,"%s",local_13a8);
      }
      fprintf((FILE *)ctxt->output,"\n");
    }
    xmlCtxtGenericNodeCheck(ctxt,stack0xffffffffffffffe8);
  }
  else {
    xmlDebugErr(ctxt,0x13a1,"Node is not an element declaration");
  }
  return;
}

Assistant:

static void
xmlCtxtDumpElemDecl(xmlDebugCtxtPtr ctxt, xmlElementPtr elem)
{
    xmlCtxtDumpSpaces(ctxt);

    if (elem == NULL) {
        if (!ctxt->check)
            fprintf(ctxt->output, "Element declaration is NULL\n");
        return;
    }
    if (elem->type != XML_ELEMENT_DECL) {
	xmlDebugErr(ctxt, XML_CHECK_NOT_ELEM_DECL,
	            "Node is not an element declaration");
        return;
    }
    if (elem->name != NULL) {
        if (!ctxt->check) {
            fprintf(ctxt->output, "ELEMDECL(");
            xmlCtxtDumpString(ctxt, elem->name);
            fprintf(ctxt->output, ")");
        }
    } else
	xmlDebugErr(ctxt, XML_CHECK_NO_NAME,
	            "Element declaration has no name");
    if (!ctxt->check) {
        switch (elem->etype) {
            case XML_ELEMENT_TYPE_UNDEFINED:
                fprintf(ctxt->output, ", UNDEFINED");
                break;
            case XML_ELEMENT_TYPE_EMPTY:
                fprintf(ctxt->output, ", EMPTY");
                break;
            case XML_ELEMENT_TYPE_ANY:
                fprintf(ctxt->output, ", ANY");
                break;
            case XML_ELEMENT_TYPE_MIXED:
                fprintf(ctxt->output, ", MIXED ");
                break;
            case XML_ELEMENT_TYPE_ELEMENT:
                fprintf(ctxt->output, ", MIXED ");
                break;
        }
        if ((elem->type != XML_ELEMENT_NODE) && (elem->content != NULL)) {
            char buf[5001];

            buf[0] = 0;
            xmlSnprintfElementContent(buf, 5000, elem->content, 1);
            buf[5000] = 0;
            fprintf(ctxt->output, "%s", buf);
        }
        fprintf(ctxt->output, "\n");
    }

    /*
     * Do a bit of checking
     */
    xmlCtxtGenericNodeCheck(ctxt, (xmlNodePtr) elem);
}